

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

int Ssw_RarManObjWhichOne(Ssw_RarMan_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  
  if (p->pAig->vObjs->nSize <= pObj->Id) {
    __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                  ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
  }
  iVar1 = p->pPars->nWords;
  if (0 < (long)iVar1) {
    puVar3 = p->pObjData + pObj->Id * iVar1;
    uVar4 = 0;
    do {
      if (*puVar3 != 0) {
        uVar2 = 0;
        uVar4 = uVar4 & 0xffffffff;
        do {
          if ((*puVar3 >> (uVar2 & 0x3f) & 1) != 0) {
            return (int)uVar4;
          }
          uVar2 = uVar2 + 1;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (uVar2 != 0x40);
        __assert_fail("i < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x244,"int Ssw_RarManObjWhichOne(Ssw_RarMan_t *, Aig_Obj_t *)");
      }
      uVar4 = uVar4 + 0x40;
      puVar3 = puVar3 + 1;
    } while ((long)iVar1 * 0x40 != uVar4);
  }
  return -1;
}

Assistant:

int Ssw_RarManObjWhichOne( Ssw_RarMan_t * p, Aig_Obj_t * pObj )
{
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    word Flip = 0;//pObj->fPhase ? ~(word)0 : 0; // bug fix!
    int w, i;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] ^ Flip )
        {
            for ( i = 0; i < 64; i++ )
                if ( ((pSim[w] ^ Flip) >> i) & 1 )
                    break;
            assert( i < 64 );
            return w * 64 + i;
        }
    return -1;
}